

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogf_tools.cxx
# Opt level: O3

void __thiscall omf_tools::process(omf_tools *this,cl_parser *cl)

{
  char *source;
  bool bVar1;
  target_format tVar2;
  int iVar3;
  xr_ogf_v4 *this_00;
  long lVar4;
  size_t sVar5;
  
  tVar2 = object_tools::get_target_format((object_tools *)this,cl);
  if ((TARGET_SKLS < tVar2) ||
     ((0x15U >> (tVar2 & (TARGET_OBJECT|TARGET_BONES|TARGET_SKLS|TARGET_SKL|TARGET_INFO)) & 1) == 0)
     ) {
    xray_re::msg("unsupported options combination");
    return;
  }
  bVar1 = batch_helper::prepare_target_name
                    (&(this->super_ogf_tools).super_object_tools.super_batch_helper,cl);
  if ((bVar1) && (sVar5 = cl->m_num_params, sVar5 != 0)) {
    lVar4 = -0x18;
    do {
      source = *(char **)((long)&cl->m_options[cl->m_argc].name + lVar4);
      this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
      xray_re::xr_ogf_v4::xr_ogf_v4(this_00);
      iVar3 = (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory.
                _vptr_xr_surface_factory[0x21])(this_00,source);
      if ((char)iVar3 == '\0') {
        xray_re::msg("can\'t load %s",source);
      }
      else if (tVar2 == TARGET_DEFAULT) {
LAB_0014b17c:
        object_tools::save_skls((object_tools *)this,(xr_object *)this_00,source);
      }
      else if (tVar2 == TARGET_SKL) {
        object_tools::save_skl((object_tools *)this,(xr_object *)this_00,source,cl);
      }
      else if (tVar2 == TARGET_SKLS) goto LAB_0014b17c;
      (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory[1]
      )(this_00);
      lVar4 = lVar4 + -0x18;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

void omf_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_DEFAULT:
	case TARGET_SKLS:
	case TARGET_SKL:
		break;
	default:
		msg("unsupported options combination");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_ogf_v4* omf = new xr_ogf_v4;
		if (omf->load_omf(source)) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_SKLS:
				save_skls(*omf, source);
				break;
			case TARGET_SKL:
				save_skl(*omf, source, cl);
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete omf;
	}
}